

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gf100.c
# Opt level: O0

void gf100_prep(disisa *isa)

{
  int iVar1;
  int f;
  int iVar2;
  int v;
  vardata *pvVar3;
  int v_gk104;
  int v_gf100;
  int vs_chipset;
  int f_gk104op;
  int f_gf100op;
  disisa *isa_local;
  
  pvVar3 = vardata_new("gf100isa");
  isa->vardata = pvVar3;
  iVar1 = vardata_add_feature(isa->vardata,"gf100op","GF100 family exclusive opcodes");
  f = vardata_add_feature(isa->vardata,"gk104op","GK104 family exclusive opcodes");
  if ((iVar1 == -1) || (f == -1)) {
    abort();
  }
  iVar2 = vardata_add_varset(isa->vardata,"chipset","GPU chipset");
  if (iVar2 == -1) {
    abort();
  }
  v = vardata_add_variant(isa->vardata,"gf100","GF100:GK104",iVar2);
  iVar2 = vardata_add_variant(isa->vardata,"gk104","GK104+",iVar2);
  if ((v != -1) && (iVar2 != -1)) {
    vardata_variant_feature(isa->vardata,v,iVar1);
    vardata_variant_feature(isa->vardata,iVar2,f);
    iVar1 = vardata_validate(isa->vardata);
    if (iVar1 != 0) {
      abort();
    }
    return;
  }
  abort();
}

Assistant:

static void gf100_prep(struct disisa *isa) {
	isa->vardata = vardata_new("gf100isa");
	int f_gf100op = vardata_add_feature(isa->vardata, "gf100op", "GF100 family exclusive opcodes");
	int f_gk104op = vardata_add_feature(isa->vardata, "gk104op", "GK104 family exclusive opcodes");
	if (f_gf100op == -1 || f_gk104op == -1)
		abort();
	int vs_chipset = vardata_add_varset(isa->vardata, "chipset", "GPU chipset");
	if (vs_chipset == -1)
		abort();
	int v_gf100 = vardata_add_variant(isa->vardata, "gf100", "GF100:GK104", vs_chipset);
	int v_gk104 = vardata_add_variant(isa->vardata, "gk104", "GK104+", vs_chipset);
	if (v_gf100 == -1 || v_gk104 == -1)
		abort();
	vardata_variant_feature(isa->vardata, v_gf100, f_gf100op);
	vardata_variant_feature(isa->vardata, v_gk104, f_gk104op);
	if (vardata_validate(isa->vardata))
		abort();
}